

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

bool __thiscall
ONX_Model::Write(ONX_Model *this,ON_BinaryArchive *archive,int version,ON_TextLog *error_log)

{
  ONX_Model_UserData *uuid;
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  long lVar6;
  ON_UUID plugin_id;
  ON_Layer layer;
  ON_Layer OStack_118;
  
  ONX_ModelPrivate::UpdateRDKUserData(this->m_private,version);
  if (version == 0) {
    version = 0;
  }
  else if (((((version < 2) || (iVar3 = ON_BinaryArchive::CurrentArchiveVersion(), iVar3 < version))
            || ((version < 0x32 &&
                (iVar3 = ON_BinaryArchive::CurrentArchiveVersion(), iVar3 / 10 < version)))) ||
           ((0x31 < version && ((uint)version % 10 != 0)))) &&
          (version = 0, error_log != (ON_TextLog *)0x0)) {
    ON_BinaryArchive::CurrentArchiveVersion();
    ON_BinaryArchive::CurrentArchiveVersion();
    version = 0;
    ON_TextLog::Print(error_log,
                      "ONX_Model::Write version parameter = %d; it must be 0, or >= 2 and <= %d, or a multiple of 10 >= 50 and <= %d.\n"
                      ,0);
  }
  bVar1 = ON_BinaryArchive::WriteMode(archive);
  if (bVar1) {
    pcVar4 = ON_String::operator_cast_to_char_(&this->m_sStartSectionComments);
    bVar1 = ON_BinaryArchive::Write3dmStartSection(archive,version,pcVar4);
    if (bVar1) {
      if ((this->m_properties).m_RevisionHistory.m_revision_count == 0) {
        ON_3dmRevisionHistory::NewRevision(&(this->m_properties).m_RevisionHistory);
      }
      bVar1 = ON_BinaryArchive::Write3dmProperties(archive,&this->m_properties);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::Write3dmSettings(archive,&this->m_settings);
        if (bVar1) {
          bVar1 = ON_BinaryArchive::BeginWrite3dmBitmapTable(archive);
          if (bVar1) {
            lVar6 = 0x18;
            if ((this->m_private->m_mcr_lists).m_count < 2) {
              lVar6 = 0;
            }
            p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                      ((long)&((this->m_private->m_mcr_lists).m_a)->m_first_mcr_link + lVar6);
            if (bVar1 && p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              do {
                bVar1 = ON_BinaryArchive::Write3dmImageComponent
                                  (archive,(ON_ModelComponentReference *)p_Var5);
                if ((error_log != (ON_TextLog *)0x0) && (!bVar1)) {
                  ON_TextLog::Print(error_log,
                                    "ONX_Model::Write archive.Write3dmImageComponent() failed.\n");
                }
                p_Var5 = (((ON_ModelComponentReference *)(p_Var5 + 1))->m_sp).
                         super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
              } while (bVar1 && p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
            }
            bVar2 = ON_BinaryArchive::EndWrite3dmBitmapTable(archive);
            if (bVar2) {
              if (bVar1 == false) {
                return false;
              }
              iVar3 = ON_BinaryArchive::Archive3dmVersion(archive);
              if (3 < iVar3) {
                bVar1 = ON_BinaryArchive::BeginWrite3dmTextureMappingTable(archive);
                if (!bVar1) {
                  if (error_log == (ON_TextLog *)0x0) {
                    return false;
                  }
                  pcVar4 = "ONX_Model::Write archive.BeginWrite3dmTextureMappingTable() failed.\n";
                  goto LAB_0046a52f;
                }
                lVar6 = 0x30;
                if ((this->m_private->m_mcr_lists).m_count < 3) {
                  lVar6 = 0;
                }
                p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          ((long)&((this->m_private->m_mcr_lists).m_a)->m_first_mcr_link + lVar6);
                if (bVar1 && p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  do {
                    bVar1 = ON_BinaryArchive::Write3dmTextureMappingComponent
                                      (archive,(ON_ModelComponentReference *)p_Var5);
                    if ((error_log != (ON_TextLog *)0x0) && (!bVar1)) {
                      ON_TextLog::Print(error_log,
                                        "ONX_Model::Write archive.TextureMapping() failed.\n");
                    }
                    p_Var5 = (((ON_ModelComponentReference *)(p_Var5 + 1))->m_sp).
                             super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                  } while (bVar1 && p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
                }
                bVar2 = ON_BinaryArchive::EndWrite3dmTextureMappingTable(archive);
                if (!bVar2) {
                  if (error_log == (ON_TextLog *)0x0) {
                    return false;
                  }
                  pcVar4 = "ONX_Model::Write archive.EndWrite3dmTextureMappingTable() failed.\n";
                  goto LAB_0046a52f;
                }
                if (bVar1 == false) {
                  return false;
                }
              }
              bVar1 = ON_BinaryArchive::BeginWrite3dmMaterialTable(archive);
              if (bVar1) {
                lVar6 = 0x48;
                if ((this->m_private->m_mcr_lists).m_count < 4) {
                  lVar6 = 0;
                }
                p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          ((long)&((this->m_private->m_mcr_lists).m_a)->m_first_mcr_link + lVar6);
                if (bVar1 && p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  do {
                    bVar1 = ON_BinaryArchive::Write3dmMaterialComponent
                                      (archive,(ON_ModelComponentReference *)p_Var5);
                    if ((error_log != (ON_TextLog *)0x0) && (!bVar1)) {
                      ON_TextLog::Print(error_log,
                                        "ONX_Model::Write archive.Write3dmMaterialComponent() failed.\n"
                                       );
                    }
                    p_Var5 = (((ON_ModelComponentReference *)(p_Var5 + 1))->m_sp).
                             super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                  } while (bVar1 && p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
                }
                bVar2 = ON_BinaryArchive::EndWrite3dmMaterialTable(archive);
                if (bVar2) {
                  if (bVar1 == false) {
                    return false;
                  }
                  iVar3 = ON_BinaryArchive::Archive3dmVersion(archive);
                  if (3 < iVar3) {
                    bVar1 = ON_BinaryArchive::BeginWrite3dmLinetypeTable(archive);
                    if (!bVar1) {
                      if (error_log == (ON_TextLog *)0x0) {
                        return false;
                      }
                      pcVar4 = "ONX_Model::Write archive.BeginWrite3dmLinetypeTable() failed.\n";
                      goto LAB_0046a52f;
                    }
                    lVar6 = 0x60;
                    if ((this->m_private->m_mcr_lists).m_count < 5) {
                      lVar6 = 0;
                    }
                    p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                              ((long)&((this->m_private->m_mcr_lists).m_a)->m_first_mcr_link + lVar6
                              );
                    if (bVar1 && p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      do {
                        bVar1 = ON_BinaryArchive::Write3dmLinePatternComponent
                                          (archive,(ON_ModelComponentReference *)p_Var5);
                        if ((error_log != (ON_TextLog *)0x0) && (!bVar1)) {
                          ON_TextLog::Print(error_log,
                                            "ONX_Model::Write archive.Write3dmLinePatternComponent() failed.\n"
                                           );
                        }
                        p_Var5 = (((ON_ModelComponentReference *)(p_Var5 + 1))->m_sp).
                                 super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi;
                      } while (bVar1 && p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0);
                    }
                    bVar2 = ON_BinaryArchive::EndWrite3dmLinetypeTable(archive);
                    if (!bVar2) {
                      if (error_log == (ON_TextLog *)0x0) {
                        return false;
                      }
                      pcVar4 = "ONX_Model::Write archive.EndWrite3dmLinetypeTable() failed.\n";
                      goto LAB_0046a52f;
                    }
                    if (bVar1 == false) {
                      return false;
                    }
                  }
                  bVar1 = ON_BinaryArchive::BeginWrite3dmLayerTable(archive);
                  if (bVar1) {
                    lVar6 = 0x78;
                    if ((this->m_private->m_mcr_lists).m_count < 6) {
                      lVar6 = 0;
                    }
                    p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                              ((long)&((this->m_private->m_mcr_lists).m_a)->m_first_mcr_link + lVar6
                              );
                    if (bVar1 && p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      iVar3 = 0;
                      do {
                        bVar1 = ON_BinaryArchive::Write3dmLayerComponent
                                          (archive,(ON_ModelComponentReference *)p_Var5);
                        if (bVar1) {
                          iVar3 = iVar3 + 1;
                        }
                        else if (error_log != (ON_TextLog *)0x0) {
                          ON_TextLog::Print(error_log,
                                            "ONX_Model::Write archive.Write3dmLayerComponent() failed.\n"
                                           );
                        }
                        p_Var5 = (((ON_ModelComponentReference *)(p_Var5 + 1))->m_sp).
                                 super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi;
                      } while (bVar1 && p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0);
                      bVar2 = iVar3 == 0;
                    }
                    else {
                      bVar2 = true;
                    }
                    if ((bVar2) && (bVar1 != false)) {
                      ON_Layer::ON_Layer(&OStack_118,&ON_Layer::Default);
                      ON_ModelComponent::SetId(&OStack_118.super_ON_ModelComponent);
                      ON_ModelComponent::SetIndex(&OStack_118.super_ON_ModelComponent,0);
                      bVar1 = ON_BinaryArchive::Write3dmLayer(archive,&OStack_118);
                      if (error_log != (ON_TextLog *)0x0 && !bVar1) {
                        ON_TextLog::Print(error_log,
                                          "ONX_Model::Write archive.Write3dmLayer() failed.\n");
                      }
                      ON_Layer::~ON_Layer(&OStack_118);
                    }
                    bVar2 = ON_BinaryArchive::EndWrite3dmLayerTable(archive);
                    if (bVar2) {
                      if (bVar1 == false) {
                        return false;
                      }
                      bVar1 = ON_BinaryArchive::BeginWrite3dmGroupTable(archive);
                      if (bVar1) {
                        lVar6 = 0x90;
                        if ((this->m_private->m_mcr_lists).m_count < 7) {
                          lVar6 = 0;
                        }
                        p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                  ((long)&((this->m_private->m_mcr_lists).m_a)->m_first_mcr_link +
                                  lVar6);
                        if (bVar1 && p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                        {
                          do {
                            bVar1 = ON_BinaryArchive::Write3dmGroupComponent
                                              (archive,(ON_ModelComponentReference *)p_Var5);
                            if ((error_log != (ON_TextLog *)0x0) && (!bVar1)) {
                              ON_TextLog::Print(error_log,
                                                "ONX_Model::Write archive.Write3dmGroupComponent() failed.\n"
                                               );
                            }
                            p_Var5 = (((ON_ModelComponentReference *)(p_Var5 + 1))->m_sp).
                                     super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi;
                          } while (bVar1 && p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0);
                        }
                        bVar2 = ON_BinaryArchive::EndWrite3dmGroupTable(archive);
                        if (bVar2) {
                          if (bVar1 == false) {
                            return false;
                          }
                          iVar3 = ON_BinaryArchive::Archive3dmVersion(archive);
                          if (2 < iVar3) {
                            bVar1 = ON_BinaryArchive::BeginWrite3dmDimStyleTable(archive);
                            if (!bVar1) {
                              if (error_log == (ON_TextLog *)0x0) {
                                return false;
                              }
                              pcVar4 = 
                              "ONX_Model::Write archive.BeginWrite3dmDimStyleTable() failed.\n";
                              goto LAB_0046a52f;
                            }
                            lVar6 = 0xc0;
                            if ((this->m_private->m_mcr_lists).m_count < 9) {
                              lVar6 = 0;
                            }
                            for (p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                           ((long)&((this->m_private->m_mcr_lists).m_a)->
                                                   m_first_mcr_link + lVar6);
                                p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                p_Var5 = (((ON_ModelComponentReference *)(p_Var5 + 1))->m_sp).
                                         super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi) {
                              bVar1 = ON_BinaryArchive::Write3dmDimStyleComponent
                                                (archive,(ON_ModelComponentReference *)p_Var5);
                              if ((error_log != (ON_TextLog *)0x0) && (!bVar1)) {
                                ON_TextLog::Print(error_log,
                                                  "ONX_Model::Write archive.Write3dmDimStyleComponent() failed.\n"
                                                 );
                              }
                            }
                            bVar2 = ON_BinaryArchive::EndWrite3dmDimStyleTable(archive);
                            if (!bVar2) {
                              if (error_log == (ON_TextLog *)0x0) {
                                return false;
                              }
                              pcVar4 = 
                              "ONX_Model::Write archive.EndWrite3dmDimStyleTable() failed.\n";
                              goto LAB_0046a52f;
                            }
                            if (bVar1 == false) {
                              return false;
                            }
                          }
                          bVar1 = ON_BinaryArchive::BeginWrite3dmLightTable(archive);
                          if (bVar1) {
                            lVar6 = 0xd8;
                            if ((this->m_private->m_mcr_lists).m_count < 10) {
                              lVar6 = 0;
                            }
                            for (p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                           ((long)&((this->m_private->m_mcr_lists).m_a)->
                                                   m_first_mcr_link + lVar6);
                                p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                p_Var5 = (((ON_ModelComponentReference *)(p_Var5 + 1))->m_sp).
                                         super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi) {
                              bVar1 = ON_BinaryArchive::Write3dmModelLightComponent
                                                (archive,(ON_ModelComponentReference *)p_Var5);
                              if ((error_log != (ON_TextLog *)0x0) && (!bVar1)) {
                                ON_TextLog::Print(error_log,
                                                  "ONX_Model::Write archive.Write3dmModelLightComponent() failed.\n"
                                                 );
                              }
                            }
                            bVar2 = ON_BinaryArchive::EndWrite3dmLightTable(archive);
                            if (bVar2) {
                              if (bVar1 == false) {
                                return false;
                              }
                              iVar3 = ON_BinaryArchive::Archive3dmVersion(archive);
                              if (3 < iVar3) {
                                bVar1 = ON_BinaryArchive::BeginWrite3dmHatchPatternTable(archive);
                                if (!bVar1) {
                                  if (error_log == (ON_TextLog *)0x0) {
                                    return false;
                                  }
                                  pcVar4 = 
                                  "ONX_Model::Write archive.BeginWrite3dmHatchPatternTable() failed.\n"
                                  ;
                                  goto LAB_0046a52f;
                                }
                                lVar6 = 0xf0;
                                if ((this->m_private->m_mcr_lists).m_count < 0xb) {
                                  lVar6 = 0;
                                }
                                for (p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                               ((long)&((this->m_private->m_mcr_lists).m_a)->
                                                       m_first_mcr_link + lVar6);
                                    p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                    p_Var5 = (((ON_ModelComponentReference *)(p_Var5 + 1))->m_sp).
                                             super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi) {
                                  bVar1 = ON_BinaryArchive::Write3dmHatchPatternComponent
                                                    (archive,(ON_ModelComponentReference *)p_Var5);
                                  if ((error_log != (ON_TextLog *)0x0) && (!bVar1)) {
                                    ON_TextLog::Print(error_log,
                                                                                                            
                                                  "ONX_Model::Write archive.Write3dmHatchPatternComponent() failed.\n"
                                                  );
                                  }
                                }
                                bVar2 = ON_BinaryArchive::EndWrite3dmHatchPatternTable(archive);
                                if (!bVar2) {
                                  if (error_log == (ON_TextLog *)0x0) {
                                    return false;
                                  }
                                  pcVar4 = 
                                  "ONX_Model::Write archive.EndWrite3dmHatchPatternTable() failed.\n"
                                  ;
                                  goto LAB_0046a52f;
                                }
                                if (bVar1 == false) {
                                  return false;
                                }
                              }
                              iVar3 = ON_BinaryArchive::Archive3dmVersion(archive);
                              if (2 < iVar3) {
                                bVar1 = ON_BinaryArchive::BeginWrite3dmInstanceDefinitionTable
                                                  (archive);
                                if (!bVar1) {
                                  if (error_log == (ON_TextLog *)0x0) {
                                    return false;
                                  }
                                  pcVar4 = 
                                  "ONX_Model::Write archive.BeginWrite3dmInstanceDefinitionTable() failed.\n"
                                  ;
                                  goto LAB_0046a52f;
                                }
                                lVar6 = 0x108;
                                if ((this->m_private->m_mcr_lists).m_count < 0xc) {
                                  lVar6 = 0;
                                }
                                for (p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                               ((long)&((this->m_private->m_mcr_lists).m_a)->
                                                       m_first_mcr_link + lVar6);
                                    p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                    p_Var5 = (((ON_ModelComponentReference *)(p_Var5 + 1))->m_sp).
                                             super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi) {
                                  bVar1 = ON_BinaryArchive::Write3dmInstanceDefinitionComponent
                                                    (archive,(ON_ModelComponentReference *)p_Var5);
                                  if ((error_log != (ON_TextLog *)0x0) && (!bVar1)) {
                                    ON_TextLog::Print(error_log,
                                                                                                            
                                                  "ONX_Model::Write archive.Write3dmInstanceDefinitionComponent() failed.\n"
                                                  );
                                  }
                                }
                                bVar2 = ON_BinaryArchive::EndWrite3dmInstanceDefinitionTable
                                                  (archive);
                                if (!bVar2) {
                                  if (error_log == (ON_TextLog *)0x0) {
                                    return false;
                                  }
                                  pcVar4 = 
                                  "ONX_Model::Write archive.EndWrite3dmInstanceDefinitionTable() failed.\n"
                                  ;
                                  goto LAB_0046a52f;
                                }
                                if (bVar1 == false) {
                                  return false;
                                }
                              }
                              bVar1 = ON_BinaryArchive::BeginWrite3dmObjectTable(archive);
                              if (bVar1) {
                                lVar6 = 0x120;
                                if ((this->m_private->m_mcr_lists).m_count < 0xd) {
                                  lVar6 = 0;
                                }
                                for (p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                               ((long)&((this->m_private->m_mcr_lists).m_a)->
                                                       m_first_mcr_link + lVar6);
                                    p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                    p_Var5 = (((ON_ModelComponentReference *)(p_Var5 + 1))->m_sp).
                                             super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi) {
                                  bVar1 = ON_BinaryArchive::Write3dmModelGeometryComponent
                                                    (archive,(ON_ModelComponentReference *)p_Var5);
                                  if ((error_log != (ON_TextLog *)0x0) && (!bVar1)) {
                                    ON_TextLog::Print(error_log,
                                                                                                            
                                                  "ONX_Model::Write archive.Write3dmModelGeometryComponent() failed.\n"
                                                  );
                                  }
                                }
                                bVar2 = ON_BinaryArchive::EndWrite3dmObjectTable(archive);
                                if (bVar2) {
                                  if (bVar1 != false) {
                                    iVar3 = ON_BinaryArchive::Archive3dmVersion(archive);
                                    if (3 < iVar3) {
                                      bVar1 = ON_BinaryArchive::BeginWrite3dmHistoryRecordTable
                                                        (archive);
                                      if (!bVar1) {
                                        if (error_log == (ON_TextLog *)0x0) {
                                          return false;
                                        }
                                        pcVar4 = 
                                        "ONX_Model::Write archive.BeginWrite3dmHistoryRecordTable() failed.\n"
                                        ;
                                        goto LAB_0046a52f;
                                      }
                                      lVar6 = 0x138;
                                      if ((this->m_private->m_mcr_lists).m_count < 0xe) {
                                        lVar6 = 0;
                                      }
                                      for (p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                      **)((long)&((this->m_private->m_mcr_lists).m_a
                                                                 )->m_first_mcr_link + lVar6);
                                          p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                    0x0;
                                          p_Var5 = (((ON_ModelComponentReference *)(p_Var5 + 1))->
                                                   m_sp).
                                                  super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi) {
                                        bVar1 = ON_BinaryArchive::Write3dmHistoryRecordComponent
                                                          (archive,(ON_ModelComponentReference *)
                                                                   p_Var5);
                                        if ((error_log != (ON_TextLog *)0x0) && (!bVar1)) {
                                          ON_TextLog::Print(error_log,
                                                                                                                        
                                                  "ONX_Model::Write archive.Write3dmistoryRecordComponent() failed.\n"
                                                  );
                                        }
                                      }
                                      bVar2 = ON_BinaryArchive::EndWrite3dmHistoryRecordTable
                                                        (archive);
                                      if (!bVar2) {
                                        if (error_log == (ON_TextLog *)0x0) {
                                          return false;
                                        }
                                        pcVar4 = 
                                        "ONX_Model::Write archive.EndWrite3dmHistoryTable() failed.\n"
                                        ;
                                        goto LAB_0046a52f;
                                      }
                                      if (bVar1 == false) {
                                        return false;
                                      }
                                    }
                                    bVar2 = ON_BinaryArchive::ArchiveContains3dmTable
                                                      (archive,user_table);
                                    if (bVar2) {
                                      if ((&this->m_model_user_string_list->super_ON_Object !=
                                           (ON_Object *)0x0) &&
                                         (iVar3 = ON_Object::UserStringCount
                                                            (&this->m_model_user_string_list->
                                                              super_ON_Object), 0 < iVar3)) {
                                        plugin_id = ON_ClassId::Uuid(&ON_DocumentUserStringList::
                                                                                                                                            
                                                  m_ON_DocumentUserStringList_class_rtti);
                                        bVar2 = ON_BinaryArchive::BeginWrite3dmUserTable
                                                          (archive,plugin_id,false,0,0);
                                        if (bVar2) {
                                          ON_BinaryArchive::WriteObject
                                                    (archive,&this->m_model_user_string_list->
                                                              super_ON_Object);
                                          ON_BinaryArchive::EndWrite3dmUserTable(archive);
                                        }
                                      }
                                      if ((0 < (this->m_userdata_table).m_count & bVar1) == 1) {
                                        lVar6 = 1;
                                        do {
                                          uuid = (this->m_userdata_table).m_a[lVar6 + -1];
                                          if ((uuid != (ONX_Model_UserData *)0x0) &&
                                             (bVar2 = ON_UuidIsNotNil(&uuid->m_uuid), bVar2)) {
                                            ON_BinaryArchive::Write3dmAnonymousUserTableRecord
                                                      (archive,uuid->m_uuid,
                                                       uuid->m_usertable_3dm_version,
                                                       uuid->m_usertable_opennurbs_version,
                                                       &uuid->m_goo);
                                          }
                                          bVar2 = lVar6 < (this->m_userdata_table).m_count;
                                          lVar6 = lVar6 + 1;
                                        } while ((bVar1 & bVar2) != 0);
                                      }
                                    }
                                    bVar2 = ON_BinaryArchive::Write3dmEndMark(archive);
                                    if (bVar2) {
                                      return bVar1;
                                    }
                                    if (error_log != (ON_TextLog *)0x0) {
                                      pcVar4 = 
                                      "ONX_Model::Write archive.Write3dmEndMark() failed.\n";
                                      goto LAB_0046a52f;
                                    }
                                  }
                                }
                                else if (error_log != (ON_TextLog *)0x0) {
                                  pcVar4 = 
                                  "ONX_Model::Write archive.EndWrite3dmObjectTable() failed.\n";
                                  goto LAB_0046a52f;
                                }
                                return false;
                              }
                              if (error_log == (ON_TextLog *)0x0) {
                                return false;
                              }
                              pcVar4 = 
                              "ONX_Model::Write archive.BeginWrite3dmObjectTable() failed.\n";
                            }
                            else {
                              if (error_log == (ON_TextLog *)0x0) {
                                return false;
                              }
                              pcVar4 = "ONX_Model::Write archive.EndWrite3dmLightTable() failed.\n";
                            }
                          }
                          else {
                            if (error_log == (ON_TextLog *)0x0) {
                              return false;
                            }
                            pcVar4 = "ONX_Model::Write archive.BeginWrite3dmLightTable() failed.\n";
                          }
                        }
                        else {
                          if (error_log == (ON_TextLog *)0x0) {
                            return false;
                          }
                          pcVar4 = "ONX_Model::Write archive.EndWrite3dmGroupTable() failed.\n";
                        }
                      }
                      else {
                        if (error_log == (ON_TextLog *)0x0) {
                          return false;
                        }
                        pcVar4 = "ONX_Model::Write archive.BeginWrite3dmGroupTable() failed.\n";
                      }
                    }
                    else {
                      if (error_log == (ON_TextLog *)0x0) {
                        return false;
                      }
                      pcVar4 = "ONX_Model::Write archive.EndWrite3dmLayerTable() failed.\n";
                    }
                  }
                  else {
                    if (error_log == (ON_TextLog *)0x0) {
                      return false;
                    }
                    pcVar4 = "ONX_Model::Write archive.BeginWrite3dmLayerTable() failed.\n";
                  }
                }
                else {
                  if (error_log == (ON_TextLog *)0x0) {
                    return false;
                  }
                  pcVar4 = "ONX_Model::Write archive.EndWrite3dmMaterialTable() failed.\n";
                }
              }
              else {
                if (error_log == (ON_TextLog *)0x0) {
                  return false;
                }
                pcVar4 = "ONX_Model::Write archive.BeginWrite3dmMaterialTable() failed.\n";
              }
            }
            else {
              if (error_log == (ON_TextLog *)0x0) {
                return false;
              }
              pcVar4 = "ONX_Model::Write archive.EndWrite3dmBitmapTable() failed.\n";
            }
          }
          else {
            if (error_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar4 = "ONX_Model::Write archive.BeginWrite3dmBitmapTable() failed.\n";
          }
        }
        else {
          if (error_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar4 = 
          "ONX_Model::Write archive.Write3dmSettings() failed.\nYour m_settings information is not valid or basic file writing failed.\n"
          ;
        }
      }
      else {
        if (error_log == (ON_TextLog *)0x0) {
          return false;
        }
        pcVar4 = 
        "ONX_Model::Write archive.Write3dmProperties() failed.\nYour m_properties information is not valid or basic file writing failed.\n"
        ;
      }
    }
    else {
      if (error_log == (ON_TextLog *)0x0) {
        return false;
      }
      pcVar4 = 
      "ONX_Model::Write archive.Write3dmStartSection() failed.\nYour archive is not properly initialized\n(make sure you passed ON::archive_mode::write3dm to the constructor),\na file is locked, a disk is locked, or something along those lines.\n"
      ;
    }
  }
  else {
    if (error_log == (ON_TextLog *)0x0) {
      return false;
    }
    pcVar4 = 
    "ONX_Model::Write archive.Mode() is not ON::archive_mode::write3dm.\nSee ONX_Model::Write example in the header file.\n"
    ;
  }
LAB_0046a52f:
  ON_TextLog::Print(error_log,pcVar4);
  return false;
}

Assistant:

bool ONX_Model::Write(ON_BinaryArchive& archive, int version, ON_TextLog* error_log) const
{
  m_private->UpdateRDKUserData(version);

  if ( 0 != version )
  {
    if (  version < 2
      ||  version > ON_BinaryArchive::CurrentArchiveVersion()
      || (version < 50 && version > ON_BinaryArchive::CurrentArchiveVersion()/10)
      || (version >= 50 && 0 != (version % 10))
      )
    {
      version = 0;
      if ( error_log) error_log->Print("ONX_Model::Write version parameter = %d; it must be 0, or >= 2 and <= %d, or a multiple of 10 >= 50 and <= %d.\n",
                      version,ON_BinaryArchive::CurrentArchiveVersion()/10,ON_BinaryArchive::CurrentArchiveVersion());
    }
  }

  if ( !archive.WriteMode() )
  {
    // You passed in a bogus archive. You must pass ON::archive_mode::write3dm to the archive constructor.
    if ( error_log) error_log->Print("ONX_Model::Write archive.Mode() is not ON::archive_mode::write3dm.\n"
                    "See ONX_Model::Write example in the header file.\n");
    return false;
  }

  bool ok;

  // START SECTION
  ok = archive.Write3dmStartSection( version, static_cast< const char* >(m_sStartSectionComments) );
  if ( !ok )
  {
    // make sure your archive was created with ON::archive_mode::write3dm mode.
    if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmStartSection() failed.\n"
                    "Your archive is not properly initialized\n"
                    "(make sure you passed ON::archive_mode::write3dm to the constructor),\n"
                    "a file is locked, a disk is locked, or something along those lines.\n");
    return false;
  }

  // PROPERTIES SECTION
  if ( m_properties.m_RevisionHistory.m_revision_count == 0 )
    const_cast<ONX_Model*>(this)->m_properties.m_RevisionHistory.NewRevision();

  ok = archive.Write3dmProperties( m_properties );
  if ( !ok )
  {
    // make sure m_properties is valid
    if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmProperties() failed.\n"
                    "Your m_properties information is not valid or basic file writing failed.\n"
                    );
    return false;
  }

  // SETTINGS SECTION
  ok = archive.Write3dmSettings( m_settings );
  if ( !ok )
  {
    // make sure m_settings is valid
    if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmSettings() failed.\n"
                    "Your m_settings information is not valid or basic file writing failed.\n");
    return false;
  }

  // BITMAP TABLE
  ok = archive.BeginWrite3dmBitmapTable();
  if ( !ok )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmBitmapTable() failed.\n");
    return false;
  }
  
  for( 
    class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::Image).m_first_mcr_link;
    nullptr != link && ok;
    link = link->m_next
    )
  {
    ok = archive.Write3dmImageComponent(link->m_mcr);
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmImageComponent() failed.\n");
    }
  } 

  if ( !archive.EndWrite3dmBitmapTable() )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmBitmapTable() failed.\n");
    return false;
  }
  if (!ok)
    return false;


  // TEXTURE MAPPING TABLE
  if ( archive.Archive3dmVersion() >= 4 )
  {
    ok = archive.BeginWrite3dmTextureMappingTable();
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmTextureMappingTable() failed.\n");
      return false;
    }

    for( 
      class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::TextureMapping).m_first_mcr_link;
      nullptr != link && ok;
      link = link->m_next
      )
    {
      ok = archive.Write3dmTextureMappingComponent(link->m_mcr);
      if ( !ok )
      {
        if ( error_log) error_log->Print("ONX_Model::Write archive.TextureMapping() failed.\n");
      }
    } 

    if ( !archive.EndWrite3dmTextureMappingTable() )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmTextureMappingTable() failed.\n");
      return false;
    }
    if (!ok)
      return false;
  }

  // MATERIAL TABLE
  ok = archive.BeginWrite3dmMaterialTable();
  if ( !ok )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmMaterialTable() failed.\n");
    return false;
  }

  for( 
    class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::RenderMaterial).m_first_mcr_link;
    nullptr != link && ok;
    link = link->m_next
    )
  {
    ok = archive.Write3dmMaterialComponent(link->m_mcr);
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmMaterialComponent() failed.\n");
    }
  } 

  if ( !archive.EndWrite3dmMaterialTable() )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmMaterialTable() failed.\n");
    return false;
  }
  if (!ok)
    return false;

  // LINETYPE TABLE
  if ( archive.Archive3dmVersion() >= 4 )
  {
    ok = archive.BeginWrite3dmLinetypeTable();
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmLinetypeTable() failed.\n");
      return false;
    }
    for( 
      class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::LinePattern).m_first_mcr_link;
      nullptr != link && ok;
      link = link->m_next
      )
    {
      ok = archive.Write3dmLinePatternComponent(link->m_mcr);
      if ( !ok )
      {
        if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmLinePatternComponent() failed.\n");
      }
    }
    if ( !archive.EndWrite3dmLinetypeTable() )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmLinetypeTable() failed.\n");
      return false;
    }
    if (!ok)
      return false;
  }

  // LAYER TABLE
  ok = archive.BeginWrite3dmLayerTable();
  if ( !ok )
  {
    // make sure m_settings is valid
    if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmLayerTable() failed.\n");
    return false;
  }
  unsigned int layer_count = 0;
  for( 
    class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::Layer).m_first_mcr_link;
    nullptr != link && ok;
    link = link->m_next
    )
  {
    ok = archive.Write3dmLayerComponent(link->m_mcr);
    if (!ok)
    {
      if (error_log) error_log->Print("ONX_Model::Write archive.Write3dmLayerComponent() failed.\n");
    }
    else
      layer_count++;
  }
  if (0 == layer_count && ok)
  {
    ON_Layer layer(ON_Layer::Default);
    layer.SetId();
    layer.SetIndex(0);
    ok = archive.Write3dmLayer(layer);
    if (!ok)
    {
      if (error_log) error_log->Print("ONX_Model::Write archive.Write3dmLayer() failed.\n");
    }
  }
  if ( !archive.EndWrite3dmLayerTable() )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmLayerTable() failed.\n");
    return false;
  }
  if (!ok)
    return false;

  // GROUP TABLE
  ok = archive.BeginWrite3dmGroupTable();
  if ( !ok )
  {
    // make sure m_settings is valid
    if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmGroupTable() failed.\n");
    return false;
  }
  for( 
    class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::Group).m_first_mcr_link;
    nullptr != link && ok;
    link = link->m_next
    )
  {
    ok = archive.Write3dmGroupComponent(link->m_mcr);
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmGroupComponent() failed.\n");
    }
  } 
  if ( !archive.EndWrite3dmGroupTable() )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmGroupTable() failed.\n");
    return false;
  }
  if (!ok)
    return false;

  // DIMSTYLE TABLE
  if ( archive.Archive3dmVersion() >= 3 )
  {
    ok = archive.BeginWrite3dmDimStyleTable();
    if ( !ok )
    {
      // make sure m_settings is valid
      if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmDimStyleTable() failed.\n");
      return false;
    }
    for( 
      class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::DimStyle).m_first_mcr_link;
      nullptr != link;
      link = link->m_next
      )
    {
      ok = archive.Write3dmDimStyleComponent(link->m_mcr);
      if (!ok)
      {
        if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmDimStyleComponent() failed.\n");
      }
    }
    if ( !archive.EndWrite3dmDimStyleTable() )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmDimStyleTable() failed.\n");
      return false;
    }
    if (!ok)
      return false;
  }

  // LIGHT TABLE
  ok = archive.BeginWrite3dmLightTable();
  if ( !ok )
  {
    // make sure m_settings is valid
    if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmLightTable() failed.\n");
    return false;
  }
  for( 
    class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::RenderLight).m_first_mcr_link;
    nullptr != link;
    link = link->m_next
    )
  {
    ok = archive.Write3dmModelLightComponent(link->m_mcr);
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmModelLightComponent() failed.\n");
    }
  }
  if ( !archive.EndWrite3dmLightTable() )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmLightTable() failed.\n");
    return false;
  }
  if (!ok)
    return false;

  // HATCH PATTERN TABLE
  if ( archive.Archive3dmVersion() >= 4 )
  {
    ok = archive.BeginWrite3dmHatchPatternTable();
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmHatchPatternTable() failed.\n");
      return false;
    }

    for( 
      class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::HatchPattern).m_first_mcr_link;
      nullptr != link;
      link = link->m_next
      )
    {
      ok = archive.Write3dmHatchPatternComponent(link->m_mcr);
      if ( !ok )
      {
        if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmHatchPatternComponent() failed.\n");
      }
    }

    if ( !archive.EndWrite3dmHatchPatternTable() )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmHatchPatternTable() failed.\n");
      return false;
    }
    if (!ok)
      return false;
  }

  // INSTANCE DEFINITION TABLE
  if ( archive.Archive3dmVersion() >= 3 )
  {
    ok = archive.BeginWrite3dmInstanceDefinitionTable();
    if ( !ok )
    {
      // make sure m_settings is valid
      if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmInstanceDefinitionTable() failed.\n");
      return false;
    }
    for( 
      class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::InstanceDefinition).m_first_mcr_link;
      nullptr != link;
      link = link->m_next
      )
    {
      ok = archive.Write3dmInstanceDefinitionComponent(link->m_mcr);
      if ( !ok )
      {
        if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmInstanceDefinitionComponent() failed.\n");
      }
    }
    if ( !archive.EndWrite3dmInstanceDefinitionTable() )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmInstanceDefinitionTable() failed.\n");
      return false;
    }
    if (!ok)
      return false;
  }

  // OBJECT TABLE
  ok = archive.BeginWrite3dmObjectTable();
  if ( !ok )
  {
    if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmObjectTable() failed.\n");
    return false;
  }
  for( 
    class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::ModelGeometry).m_first_mcr_link;
    nullptr != link;
    link = link->m_next
    )
  {
    ok = archive.Write3dmModelGeometryComponent(link->m_mcr);
    if ( !ok )
    {
      if ( error_log)
        error_log->Print("ONX_Model::Write archive.Write3dmModelGeometryComponent() failed.\n");
    }
  }
  if ( !archive.EndWrite3dmObjectTable() )
  {
    if ( error_log) 
      error_log->Print("ONX_Model::Write archive.EndWrite3dmObjectTable() failed.\n");
    return false;
  }
  if (!ok)
    return false;

  // HISTORY RECORD TABLE
  if ( archive.Archive3dmVersion() >= 4 )
  {
    ok = archive.BeginWrite3dmHistoryRecordTable();
    if ( !ok )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.BeginWrite3dmHistoryRecordTable() failed.\n");
      return false;
    }

    for( 
      class ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::HistoryRecord).m_first_mcr_link;
      nullptr != link;
      link = link->m_next
      )
    {
      ok = archive.Write3dmHistoryRecordComponent(link->m_mcr);
      if ( !ok )
      {
        if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmistoryRecordComponent() failed.\n");
      }
    }


    if( !archive.EndWrite3dmHistoryRecordTable() )
    {
      if ( error_log) error_log->Print("ONX_Model::Write archive.EndWrite3dmHistoryTable() failed.\n");
      return false;
    }
    if (!ok)
      return false;
  }

  // STEP 17: - write user tables (plug-in info, etc.)
  if (archive.ArchiveContains3dmTable(ON_3dmArchiveTableType::user_table))
  {
    if (nullptr != m_model_user_string_list && m_model_user_string_list->UserStringCount() > 0)
    {
      // Write the document user strings (key-value pairs) as
      // a user table with plug-in id = 
      ON_UUID model_user_string_plugin_id = ON_CLASS_ID(ON_DocumentUserStringList);
      if (archive.BeginWrite3dmUserTable(model_user_string_plugin_id, false, 0, 0))
      {
        archive.WriteObject(m_model_user_string_list);
        archive.EndWrite3dmUserTable();
      }
    }

    // USER DATA TABLE
    for (int i = 0; ok && i < m_userdata_table.Count(); i++)
    {
      const ONX_Model_UserData* model_ud = m_userdata_table[i];
      if (nullptr == model_ud)
        continue;
      if (ON_UuidIsNotNil(model_ud->m_uuid))
      {
        if (!archive.Write3dmAnonymousUserTableRecord(
          model_ud->m_uuid,
          model_ud->m_usertable_3dm_version,
          model_ud->m_usertable_opennurbs_version,
          model_ud->m_goo)
          )
        {
          continue;
        }
      }
    }
  }

  if ( !archive.Write3dmEndMark() )
  {
    ok = false;
    if ( error_log) error_log->Print("ONX_Model::Write archive.Write3dmEndMark() failed.\n");
  }

  return ok;
}